

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  PreparedDictionary *pPVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  PreparedDictionary *pPVar22;
  ulong *puVar23;
  ulong uVar24;
  long lVar25;
  ulong *puVar26;
  long lVar27;
  undefined1 *puVar28;
  PreparedDictionary *pPVar29;
  byte bVar30;
  short sVar31;
  ulong *puVar32;
  PreparedDictionary *pPVar33;
  uint8_t *s1_orig_1;
  PreparedDictionary *pPVar34;
  PreparedDictionary *pPVar35;
  PreparedDictionary *pPVar36;
  PreparedDictionary *pPVar37;
  PreparedDictionary *pPVar38;
  ulong *puVar39;
  char *pcVar40;
  char cVar41;
  ulong uVar42;
  int iVar43;
  PreparedDictionary *pPVar44;
  PreparedDictionary *pPVar45;
  PreparedDictionary *pPVar46;
  bool bVar47;
  long lVar48;
  long lVar49;
  PreparedDictionary *local_140;
  PreparedDictionary *local_138;
  ulong local_130;
  PreparedDictionary *local_128;
  PreparedDictionary *local_118;
  ulong local_108;
  size_t *local_d8;
  ulong auStack_58 [5];
  
  local_140 = *(PreparedDictionary **)dist_cache;
  puVar3 = (undefined1 *)(position + num_bytes);
  pPVar22 = (PreparedDictionary *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pPVar22 = (PreparedDictionary *)position;
  }
  pPVar44 = (PreparedDictionary *)0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    pPVar44 = (PreparedDictionary *)0x40;
  }
  if ((undefined1 *)(position + 8) < puVar3) {
    pPVar36 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
    lVar9 = *(long *)(literal_context_lut + 0x10);
    lVar10 = *(long *)(literal_context_lut + 0x60);
    pPVar33 = (PreparedDictionary *)((long)&pPVar44->magic + position);
    sVar11 = (params->dictionary).compound.num_chunks;
    uVar15 = (uint)ringbuffer_mask;
    pPVar1 = (PreparedDictionary *)(puVar3 + -7);
    lVar5 = position - 1;
    local_d8 = last_insert_len;
    pPVar35 = pPVar36;
    pPVar29 = (PreparedDictionary *)position;
    do {
      local_138 = (PreparedDictionary *)(puVar3 + -(long)pPVar29);
      pPVar37 = pPVar36;
      if (pPVar29 < pPVar36) {
        pPVar37 = pPVar29;
      }
      uVar42 = (ulong)pPVar29 & ringbuffer_mask;
      puVar4 = (ulong *)(ringbuffer + uVar42);
      bVar30 = ringbuffer[uVar42];
      local_118 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      local_108 = 0x7e4;
      if (((PreparedDictionary *)((long)pPVar29 - (long)local_118) < pPVar29) &&
         (uVar17 = (uint)(PreparedDictionary *)((long)pPVar29 - (long)local_118) & uVar15,
         bVar30 == ringbuffer[uVar17])) {
        puVar23 = (ulong *)(ringbuffer + uVar17);
        puVar26 = puVar4;
        puVar39 = puVar23;
        for (pPVar46 = local_138; (PreparedDictionary *)0x7 < pPVar46;
            pPVar46 = (PreparedDictionary *)&pPVar46[-1].bucket_bits) {
          uVar24 = *puVar26;
          uVar12 = *puVar39;
          if (uVar24 == uVar12) {
            puVar39 = puVar39 + 1;
          }
          else {
            uVar13 = 0;
            if ((uVar12 ^ uVar24) != 0) {
              for (; ((uVar12 ^ uVar24) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            pPVar35 = (PreparedDictionary *)
                      ((long)puVar39 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar23));
          }
          pPVar34 = pPVar35;
          if (uVar24 != uVar12) goto LAB_01c26e3d;
          puVar26 = puVar26 + 1;
        }
        puVar32 = puVar39;
        if (pPVar46 != (PreparedDictionary *)0x0) {
          puVar32 = (ulong *)((long)puVar39 + (long)pPVar46);
          pPVar35 = (PreparedDictionary *)0x0;
          do {
            if (*(char *)((long)puVar39 + (long)pPVar35) != *(char *)((long)puVar26 + (long)pPVar35)
               ) {
              puVar32 = (ulong *)((long)puVar39 + (long)pPVar35);
              break;
            }
            pPVar35 = (PreparedDictionary *)((long)&pPVar35->magic + 1);
          } while (pPVar46 != pPVar35);
        }
        pPVar34 = (PreparedDictionary *)((long)puVar32 - (long)puVar23);
LAB_01c26e3d:
        if ((pPVar34 < (PreparedDictionary *)0x4) ||
           (uVar24 = (long)pPVar34 * 0x87 + 0x78f, uVar24 < 0x7e5)) goto LAB_01c26e6b;
        bVar30 = *(byte *)((long)puVar4 + (long)pPVar34);
        local_108 = uVar24;
      }
      else {
LAB_01c26e6b:
        local_118 = (PreparedDictionary *)0x0;
        pPVar34 = (PreparedDictionary *)0x0;
      }
      uVar17 = (uint)((ulong)(*(long *)(ringbuffer + uVar42) * -0x1ca5842ca8642d00) >> 0x2c);
      lVar25 = 0;
      lVar48 = 0;
      lVar49 = 1;
      do {
        auStack_58[lVar25] = lVar48 * 8 + (ulong)uVar17 & 0xfffff;
        auStack_58[lVar25 + 1] = lVar49 * 8 + (ulong)uVar17 & 0xfffff;
        lVar25 = lVar25 + 2;
        lVar48 = lVar48 + 2;
        lVar49 = lVar49 + 2;
      } while (lVar25 != 4);
      uVar17 = (uint)pPVar29;
      lVar48 = 0;
      do {
        uVar20 = *(uint *)(sVar11 + auStack_58[lVar48] * 4);
        puVar26 = (ulong *)(ringbuffer + (uVar15 & uVar20));
        bVar6 = *(byte *)((long)&pPVar34->magic + (long)puVar26);
        pPVar46 = (PreparedDictionary *)(ulong)bVar6;
        if (((bVar30 == bVar6) && (pPVar29 != (PreparedDictionary *)(ulong)uVar20)) &&
           (pPVar45 = (PreparedDictionary *)((long)pPVar29 - (long)(ulong)uVar20),
           pPVar38 = local_138, puVar39 = puVar4, puVar23 = puVar26, pPVar45 <= pPVar37)) {
          for (; (PreparedDictionary *)0x7 < pPVar38;
              pPVar38 = (PreparedDictionary *)&pPVar38[-1].bucket_bits) {
            uVar42 = *puVar39;
            uVar24 = *puVar23;
            if (uVar42 == uVar24) {
              puVar23 = puVar23 + 1;
            }
            else {
              uVar12 = 0;
              if ((uVar24 ^ uVar42) != 0) {
                for (; ((uVar24 ^ uVar42) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              pPVar35 = (PreparedDictionary *)((long)puVar23 - (long)puVar26);
              pPVar46 = (PreparedDictionary *)((long)&pPVar35->magic + (uVar12 >> 3 & 0x1fffffff));
            }
            if (uVar42 != uVar24) goto LAB_01c26fa7;
            puVar39 = puVar39 + 1;
          }
          puVar32 = puVar23;
          if (pPVar38 != (PreparedDictionary *)0x0) {
            puVar32 = (ulong *)((long)puVar23 + (long)pPVar38);
            pPVar46 = (PreparedDictionary *)0x0;
            do {
              pPVar35 = (PreparedDictionary *)
                        CONCAT71((int7)((ulong)pPVar35 >> 8),
                                 *(char *)((long)puVar23 + (long)pPVar46));
              if (*(char *)((long)puVar23 + (long)pPVar46) !=
                  *(char *)((long)puVar39 + (long)pPVar46)) {
                puVar32 = (ulong *)((long)puVar23 + (long)pPVar46);
                break;
              }
              pPVar46 = (PreparedDictionary *)((long)&pPVar46->magic + 1);
            } while (pPVar38 != pPVar46);
          }
          pPVar46 = (PreparedDictionary *)((long)puVar32 - (long)puVar26);
LAB_01c26fa7:
          if ((PreparedDictionary *)0x3 < pPVar46) {
            iVar21 = 0x1f;
            if ((uint)pPVar45 != 0) {
              for (; (uint)pPVar45 >> iVar21 == 0; iVar21 = iVar21 + -1) {
              }
            }
            uVar42 = (ulong)(iVar21 * -0x1e + 0x780) + (long)pPVar46 * 0x87;
            if (local_108 < uVar42) {
              bVar30 = *(byte *)((long)puVar4 + (long)pPVar46);
              pPVar34 = pPVar46;
              local_118 = pPVar45;
              local_108 = uVar42;
            }
          }
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != 4);
      *(uint *)(sVar11 + *(long *)((long)auStack_58 + (ulong)(uVar17 & 0x18)) * 4) = uVar17;
      if ((PreparedDictionary *)0x1f < local_138 && ((ulong)pPVar29 & 3) == 0) {
        pPVar38 = (params->dictionary).compound.chunks[1];
        if (pPVar38 <= pPVar29) {
          uVar20 = (uint)(params->dictionary).compound.total_size;
          uVar19 = *(uint *)((long)(params->dictionary).compound.chunks + 0x14);
          iVar21 = *(int *)((params->dictionary).compound.chunks + 3);
          do {
            uVar18 = uVar20 & 0x3fffffff;
            bVar30 = ringbuffer[(ulong)pPVar38 & ringbuffer_mask];
            bVar6 = ringbuffer[(ulong)&pPVar38[1].source_size & ringbuffer_mask];
            if (uVar18 < 0x1000000) {
              pPVar35 = (params->dictionary).compound.chunks[0];
              uVar7 = (&pPVar35->magic)[uVar18];
              (&pPVar35->magic)[uVar18] = (uint32_t)pPVar38;
              if ((pPVar38 == pPVar29) && (uVar7 != 0xffffffff)) {
                uVar18 = uVar17 - uVar7;
                if ((PreparedDictionary *)(ulong)uVar18 <= pPVar37) {
                  puVar23 = (ulong *)(ringbuffer + (uVar7 & uVar15));
                  puVar26 = puVar4;
                  puVar39 = puVar23;
                  for (pPVar35 = local_138; (PreparedDictionary *)0x7 < pPVar35;
                      pPVar35 = (PreparedDictionary *)&pPVar35[-1].bucket_bits) {
                    uVar42 = *puVar26;
                    uVar24 = *puVar39;
                    if (uVar42 == uVar24) {
                      puVar39 = puVar39 + 1;
                    }
                    else {
                      uVar12 = 0;
                      if ((uVar24 ^ uVar42) != 0) {
                        for (; ((uVar24 ^ uVar42) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                        }
                      }
                      pPVar46 = (PreparedDictionary *)
                                ((long)puVar39 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar23));
                    }
                    if (uVar42 != uVar24) goto LAB_01c2717b;
                    puVar26 = puVar26 + 1;
                  }
                  puVar32 = puVar39;
                  if (pPVar35 != (PreparedDictionary *)0x0) {
                    puVar32 = (ulong *)((long)puVar39 + (long)pPVar35);
                    pPVar46 = (PreparedDictionary *)0x0;
                    do {
                      if (*(char *)((long)puVar39 + (long)pPVar46) !=
                          *(char *)((long)puVar26 + (long)pPVar46)) {
                        puVar32 = (ulong *)((long)puVar39 + (long)pPVar46);
                        break;
                      }
                      pPVar46 = (PreparedDictionary *)((long)&pPVar46->magic + 1);
                    } while (pPVar35 != pPVar46);
                  }
                  pPVar46 = (PreparedDictionary *)((long)puVar32 - (long)puVar23);
LAB_01c2717b:
                  if (((PreparedDictionary *)0x3 < pPVar46) && (pPVar34 < pPVar46)) {
                    iVar43 = 0x1f;
                    if (uVar18 != 0) {
                      for (; uVar18 >> iVar43 == 0; iVar43 = iVar43 + -1) {
                      }
                    }
                    uVar42 = (ulong)(iVar43 * -0x1e + 0x780) + (long)pPVar46 * 0x87;
                    if (local_108 < uVar42) {
                      pPVar34 = pPVar46;
                      local_118 = (PreparedDictionary *)(ulong)uVar18;
                      local_108 = uVar42;
                    }
                  }
                }
              }
            }
            pPVar35 = (PreparedDictionary *)(ulong)uVar19;
            uVar20 = ~(uint)bVar30 * iVar21 + (uint)bVar6 + uVar20 * uVar19 + 1;
            pPVar38 = (PreparedDictionary *)&pPVar38->num_items;
          } while (pPVar38 <= pPVar29);
          *(uint *)&(params->dictionary).compound.total_size = uVar20;
        }
        (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar29->num_items;
      }
      if (local_108 < 0x7e5) {
        local_140 = (PreparedDictionary *)((long)&local_140->magic + 1);
        position = (long)&pPVar29->magic + 1;
        if (pPVar33 < position) {
          if ((PreparedDictionary *)((long)&pPVar33->magic + (ulong)(uint)((int)pPVar44 * 4)) <
              position) {
            pPVar29 = (PreparedDictionary *)((long)&pPVar29->bucket_bits + 1);
            if (pPVar1 <= pPVar29) {
              pPVar29 = pPVar1;
            }
            for (; position < pPVar29;
                position = (size_t)&((PreparedDictionary *)position)->num_items) {
              *(uint *)(sVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                                 (position & ringbuffer_mask)) *
                                                       -0x1ca5842ca8642d00) >> 0x2c) +
                                         ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
              local_140 = (PreparedDictionary *)&local_140->num_items;
              pPVar35 = local_140;
            }
          }
          else {
            pPVar29 = (PreparedDictionary *)((long)&pPVar29->source_size + 1);
            if (pPVar1 <= pPVar29) {
              pPVar29 = pPVar1;
            }
            for (; position < pPVar29; position = (long)&((PreparedDictionary *)position)->magic + 2
                ) {
              *(uint *)(sVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                                 (position & ringbuffer_mask)) *
                                                       -0x1ca5842ca8642d00) >> 0x2c) +
                                         ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
              local_140 = (PreparedDictionary *)((long)&local_140->magic + 2);
              pPVar35 = local_140;
            }
          }
        }
      }
      else {
        lVar48 = (lVar5 + num_bytes) - (long)pPVar29;
        iVar21 = 0;
        do {
          local_138 = (PreparedDictionary *)((long)&local_138[-1].slot_bits + 3);
          pPVar35 = (PreparedDictionary *)((long)&pPVar34[-1].slot_bits + 3);
          if (local_138 <= pPVar35) {
            pPVar35 = local_138;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            pPVar35 = (PreparedDictionary *)0x0;
          }
          pPVar33 = (PreparedDictionary *)((long)&pPVar29->magic + 1);
          pPVar37 = pPVar36;
          if (pPVar33 < pPVar36) {
            pPVar37 = pPVar33;
          }
          puVar4 = (ulong *)(ringbuffer + ((ulong)pPVar33 & ringbuffer_mask));
          cVar41 = *(char *)((long)&pPVar35->magic + (long)puVar4);
          local_128 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
          local_130 = 0x7e4;
          if (((PreparedDictionary *)((long)pPVar33 - (long)local_128) < pPVar33) &&
             (puVar23 = (ulong *)(ringbuffer +
                                 ((uint)(PreparedDictionary *)((long)pPVar33 - (long)local_128) &
                                 uVar15)), pPVar46 = local_138, pPVar38 = local_138,
             puVar26 = puVar4, puVar39 = puVar23,
             cVar41 == *(char *)((long)&pPVar35->magic + (long)puVar23))) {
            for (; (PreparedDictionary *)0x7 < pPVar46;
                pPVar46 = (PreparedDictionary *)&pPVar46[-1].bucket_bits) {
              uVar42 = *puVar26;
              uVar24 = *puVar39;
              if (uVar42 == uVar24) {
                puVar39 = puVar39 + 1;
              }
              else {
                uVar12 = 0;
                if ((uVar24 ^ uVar42) != 0) {
                  for (; ((uVar24 ^ uVar42) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                pPVar38 = (PreparedDictionary *)
                          ((long)puVar39 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar23));
              }
              if (uVar42 != uVar24) goto LAB_01c2734c;
              puVar26 = puVar26 + 1;
            }
            puVar32 = puVar39;
            if (pPVar46 != (PreparedDictionary *)0x0) {
              puVar32 = (ulong *)((long)puVar39 + (long)pPVar46);
              pPVar38 = (PreparedDictionary *)0x0;
              do {
                if (*(char *)((long)puVar39 + (long)pPVar38) !=
                    *(char *)((long)puVar26 + (long)pPVar38)) {
                  puVar32 = (ulong *)((long)puVar39 + (long)pPVar38);
                  break;
                }
                pPVar38 = (PreparedDictionary *)((long)&pPVar38->magic + 1);
              } while (pPVar46 != pPVar38);
            }
            pPVar38 = (PreparedDictionary *)((long)puVar32 - (long)puVar23);
LAB_01c2734c:
            if ((pPVar38 < (PreparedDictionary *)0x4) ||
               (uVar42 = (long)pPVar38 * 0x87 + 0x78f, uVar42 < 0x7e5)) {
              local_128 = (PreparedDictionary *)0x0;
            }
            else {
              cVar41 = *(char *)((long)puVar4 + (long)pPVar38);
              pPVar35 = pPVar38;
              local_130 = uVar42;
            }
          }
          else {
            local_128 = (PreparedDictionary *)0x0;
          }
          uVar17 = (uint)((ulong)(*(long *)(ringbuffer + ((ulong)pPVar33 & ringbuffer_mask)) *
                                 -0x1ca5842ca8642d00) >> 0x2c);
          lVar27 = 0;
          lVar49 = 0;
          lVar25 = 1;
          do {
            auStack_58[lVar27] = lVar49 * 8 + (ulong)uVar17 & 0xfffff;
            auStack_58[lVar27 + 1] = lVar25 * 8 + (ulong)uVar17 & 0xfffff;
            lVar27 = lVar27 + 2;
            lVar49 = lVar49 + 2;
            lVar25 = lVar25 + 2;
          } while (lVar27 != 4);
          uVar17 = (uint)pPVar33;
          lVar49 = 0;
          do {
            uVar20 = *(uint *)(sVar11 + auStack_58[lVar49] * 4);
            puVar26 = (ulong *)(ringbuffer + (uVar15 & uVar20));
            if (((cVar41 == *(char *)((long)&pPVar35->magic + (long)puVar26)) &&
                (pPVar33 != (PreparedDictionary *)(ulong)uVar20)) &&
               (pPVar45 = (PreparedDictionary *)((long)pPVar33 - (long)(ulong)uVar20),
               pPVar46 = local_138, pPVar38 = local_138, puVar39 = puVar4, puVar23 = puVar26,
               pPVar45 <= pPVar37)) {
              for (; (PreparedDictionary *)0x7 < pPVar46;
                  pPVar46 = (PreparedDictionary *)&pPVar46[-1].bucket_bits) {
                uVar42 = *puVar39;
                uVar24 = *puVar23;
                if (uVar42 == uVar24) {
                  puVar23 = puVar23 + 1;
                }
                else {
                  uVar12 = 0;
                  if ((uVar24 ^ uVar42) != 0) {
                    for (; ((uVar24 ^ uVar42) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  pPVar38 = (PreparedDictionary *)
                            ((long)puVar23 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar26));
                }
                if (uVar42 != uVar24) goto LAB_01c274a1;
                puVar39 = puVar39 + 1;
              }
              puVar32 = puVar23;
              if (pPVar46 != (PreparedDictionary *)0x0) {
                puVar32 = (ulong *)((long)puVar23 + (long)pPVar46);
                pPVar38 = (PreparedDictionary *)0x0;
                do {
                  if (*(char *)((long)puVar23 + (long)pPVar38) !=
                      *(char *)((long)puVar39 + (long)pPVar38)) {
                    puVar32 = (ulong *)((long)puVar23 + (long)pPVar38);
                    break;
                  }
                  pPVar38 = (PreparedDictionary *)((long)&pPVar38->magic + 1);
                } while (pPVar46 != pPVar38);
              }
              pPVar38 = (PreparedDictionary *)((long)puVar32 - (long)puVar26);
LAB_01c274a1:
              if ((PreparedDictionary *)0x3 < pPVar38) {
                iVar43 = 0x1f;
                if ((uint)pPVar45 != 0) {
                  for (; (uint)pPVar45 >> iVar43 == 0; iVar43 = iVar43 + -1) {
                  }
                }
                uVar42 = (ulong)(iVar43 * -0x1e + 0x780) + (long)pPVar38 * 0x87;
                if (local_130 < uVar42) {
                  cVar41 = *(char *)((long)puVar4 + (long)pPVar38);
                  pPVar35 = pPVar38;
                  local_130 = uVar42;
                  local_128 = pPVar45;
                }
              }
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 != 4);
          *(uint *)(sVar11 + *(long *)((long)auStack_58 + (ulong)(uVar17 & 0x18)) * 4) = uVar17;
          if ((PreparedDictionary *)0x1f < local_138 && ((ulong)pPVar33 & 3) == 0) {
            pPVar46 = (params->dictionary).compound.chunks[1];
            if (pPVar46 <= pPVar33) {
              uVar20 = (uint)(params->dictionary).compound.total_size;
              iVar43 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
              iVar8 = *(int *)((params->dictionary).compound.chunks + 3);
              do {
                uVar19 = uVar20 & 0x3fffffff;
                bVar30 = ringbuffer[(ulong)pPVar46 & ringbuffer_mask];
                bVar6 = ringbuffer[(ulong)&pPVar46[1].source_size & ringbuffer_mask];
                if (uVar19 < 0x1000000) {
                  pPVar38 = (params->dictionary).compound.chunks[0];
                  uVar18 = (&pPVar38->magic)[uVar19];
                  (&pPVar38->magic)[uVar19] = (uint32_t)pPVar46;
                  if ((pPVar46 == pPVar33) && (uVar18 != 0xffffffff)) {
                    uVar19 = uVar17 - uVar18;
                    if ((PreparedDictionary *)(ulong)uVar19 <= pPVar37) {
                      puVar39 = (ulong *)(ringbuffer + (uVar18 & uVar15));
                      lVar49 = 0;
                      lVar25 = 0;
                      puVar26 = puVar39;
                      do {
                        uVar42 = *(ulong *)((long)puVar4 + lVar25);
                        uVar24 = *puVar26;
                        if (uVar42 == uVar24) {
                          puVar26 = puVar26 + 1;
                        }
                        else {
                          uVar12 = 0;
                          if ((uVar24 ^ uVar42) != 0) {
                            for (; ((uVar24 ^ uVar42) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                            }
                          }
                          pPVar38 = (PreparedDictionary *)
                                    ((long)puVar26 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar39));
                        }
                        if (uVar42 != uVar24) goto LAB_01c27680;
                        lVar25 = lVar25 + 8;
                        lVar27 = lVar48 + lVar49;
                        lVar49 = lVar49 + -8;
                      } while (7 < lVar27 - 8U);
                      if (lVar25 != lVar48) {
                        pcVar40 = (char *)((long)puVar4 + lVar25);
                        lVar49 = lVar49 + lVar48;
                        puVar32 = (ulong *)((long)puVar26 + (lVar48 - lVar25));
                        puVar23 = puVar26;
                        do {
                          puVar26 = puVar23;
                          if ((char)*puVar23 != *pcVar40) break;
                          pcVar40 = pcVar40 + 1;
                          puVar23 = (ulong *)((long)puVar23 + 1);
                          lVar49 = lVar49 + -1;
                          puVar26 = puVar32;
                        } while (lVar49 != 0);
                      }
                      pPVar38 = (PreparedDictionary *)((long)puVar26 - (long)puVar39);
LAB_01c27680:
                      if (((PreparedDictionary *)0x3 < pPVar38) && (pPVar35 < pPVar38)) {
                        iVar14 = 0x1f;
                        if (uVar19 != 0) {
                          for (; uVar19 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                          }
                        }
                        uVar42 = (ulong)(iVar14 * -0x1e + 0x780) + (long)pPVar38 * 0x87;
                        if (local_130 < uVar42) {
                          pPVar35 = pPVar38;
                          local_130 = uVar42;
                          local_128 = (PreparedDictionary *)(ulong)uVar19;
                        }
                      }
                    }
                  }
                }
                uVar20 = ~(uint)bVar30 * iVar8 + (uint)bVar6 + uVar20 * iVar43 + 1;
                pPVar46 = (PreparedDictionary *)&pPVar46->num_items;
              } while (pPVar46 <= pPVar33);
              *(uint *)&(params->dictionary).compound.total_size = uVar20;
            }
            (params->dictionary).compound.chunks[1] =
                 (PreparedDictionary *)((long)&pPVar29->num_items + 1);
          }
          if (local_130 < local_108 + 0xaf) {
            bVar47 = false;
            pPVar35 = pPVar34;
            pPVar33 = pPVar29;
            iVar43 = iVar21;
          }
          else {
            local_140 = (PreparedDictionary *)((long)&local_140->magic + 1);
            iVar43 = iVar21 + 1;
            bVar47 = iVar21 < 3 && (undefined1 *)((long)&pPVar29->source_size + 1) < puVar3;
            local_108 = local_130;
            local_118 = local_128;
          }
          lVar48 = lVar48 + -1;
          pPVar34 = pPVar35;
          pPVar29 = pPVar33;
          iVar21 = iVar43;
        } while (bVar47);
        pPVar29 = (PreparedDictionary *)((long)&pPVar33->magic + lVar9);
        if (pPVar36 <= pPVar29) {
          pPVar29 = pPVar36;
        }
        pPVar29 = (PreparedDictionary *)((long)&pPVar29->magic + lVar10);
        if (pPVar29 < local_118) {
LAB_01c278b9:
          puVar28 = (undefined1 *)((long)&local_118->hash_bits + 3);
        }
        else {
          pPVar37 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
          uVar17 = 0;
          bVar47 = false;
          if (local_118 != pPVar37) {
            pPVar46 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
            if (local_118 == pPVar46) {
              uVar17 = 1;
            }
            else {
              pcVar40 = (char *)((long)local_118 + (3 - (long)pPVar37));
              if (pcVar40 < (char *)0x7) {
                bVar30 = (byte)((int)pcVar40 << 2);
                uVar17 = 0x9750468;
              }
              else {
                pcVar40 = (char *)((long)local_118 + (3 - (long)pPVar46));
                if ((char *)0x6 < pcVar40) {
                  if (local_118 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1))
                  {
                    bVar47 = local_118 !=
                             (PreparedDictionary *)
                             (long)*(int *)((long)(hasher->common).extra + 0xc);
                    uVar17 = 3;
                    goto LAB_01c278b5;
                  }
                  uVar17 = 2;
                  goto LAB_01c278b3;
                }
                bVar30 = (byte)((int)pcVar40 << 2);
                uVar17 = 0xfdb1ace;
              }
              uVar17 = uVar17 >> (bVar30 & 0x1f) & 0xf;
            }
LAB_01c278b3:
            bVar47 = false;
          }
LAB_01c278b5:
          if (bVar47) goto LAB_01c278b9;
          puVar28 = (undefined1 *)(ulong)uVar17;
        }
        if ((local_118 <= pPVar29) && (puVar28 != (undefined1 *)0x0)) {
          *(undefined4 *)((long)(hasher->common).extra + 0xc) =
               *(undefined4 *)((hasher->common).extra + 1);
          *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
          *(int *)(hasher->common).extra = (int)local_118;
        }
        *(int *)local_d8 = (int)local_140;
        iVar21 = (int)pPVar35;
        *(int *)((long)local_d8 + 4) = iVar21;
        puVar2 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
        if (puVar28 < puVar2) {
          *(short *)((long)local_d8 + 0xe) = (short)puVar28;
          iVar43 = 0;
        }
        else {
          bVar30 = (byte)*(int *)(literal_context_lut + 0x38);
          puVar28 = puVar28 + ((4L << (bVar30 & 0x3f)) -
                              (ulong)*(uint *)(literal_context_lut + 0x3c)) + -0x10;
          uVar17 = 0x1f;
          if ((uint)puVar28 != 0) {
            for (; (uint)puVar28 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar17 = (uVar17 ^ 0xffffffe0) + 0x1f;
          bVar47 = ((ulong)puVar28 >> ((ulong)uVar17 & 0x3f) & 1) != 0;
          iVar43 = uVar17 - *(int *)(literal_context_lut + 0x38);
          *(ushort *)((long)local_d8 + 0xe) =
               (short)((uint)bVar47 + iVar43 * 2 + 0xfffe << (bVar30 & 0x3f)) +
               (short)puVar2 + (~(ushort)(-1 << (bVar30 & 0x1f)) & (ushort)puVar28) |
               (short)iVar43 * 0x400;
          iVar43 = (int)((long)puVar28 - ((ulong)bVar47 + 2 << ((byte)uVar17 & 0x3f)) >>
                        (bVar30 & 0x3f));
        }
        *(int *)(local_d8 + 1) = iVar43;
        pPVar29 = local_140;
        if ((PreparedDictionary *)0x5 < local_140) {
          if (local_140 < (PreparedDictionary *)0x82) {
            puVar28 = (undefined1 *)((long)&local_140[-1].slot_bits + 2);
            uVar17 = 0x1f;
            uVar20 = (uint)puVar28;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            pPVar29 = (PreparedDictionary *)
                      (ulong)((int)((ulong)puVar28 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f))
                              + (uVar17 ^ 0xffffffe0) * 2 + 0x40);
          }
          else if (local_140 < (PreparedDictionary *)0x842) {
            uVar20 = (int)local_140 - 0x42;
            uVar17 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            pPVar29 = (PreparedDictionary *)(ulong)((uVar17 ^ 0xffe0) + 0x2a);
          }
          else {
            pPVar29 = (PreparedDictionary *)0x15;
            if ((PreparedDictionary *)0x1841 < local_140) {
              pPVar29 = (PreparedDictionary *)
                        (ulong)(ushort)(0x17 - (local_140 < (PreparedDictionary *)0x5842));
            }
          }
        }
        uVar42 = (ulong)iVar21;
        if (uVar42 < 10) {
          uVar17 = iVar21 - 2;
        }
        else if (uVar42 < 0x86) {
          uVar17 = 0x1f;
          uVar20 = (uint)(uVar42 - 6);
          if (uVar20 != 0) {
            for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar17 = (int)(uVar42 - 6 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar17 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar17 = 0x17;
          if (uVar42 < 0x846) {
            uVar17 = 0x1f;
            if (iVar21 - 0x46U != 0) {
              for (; iVar21 - 0x46U >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            uVar17 = (uVar17 ^ 0xffe0) + 0x2c;
          }
        }
        uVar16 = (ushort)uVar17;
        sVar31 = (uVar16 & 7) + ((ushort)pPVar29 & 7) * 8;
        if ((((*(ushort *)((long)local_d8 + 0xe) & 0x3ff) == 0) && ((ushort)pPVar29 < 8)) &&
           (uVar16 < 0x10)) {
          if (7 < uVar16) {
            sVar31 = sVar31 + 0x40;
          }
        }
        else {
          iVar21 = (int)(((ulong)pPVar29 & 0xffff) >> 3) * 3 + ((uVar17 & 0xffff) >> 3);
          sVar31 = sVar31 + ((ushort)(0x520d40 >> ((char)iVar21 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar21 * 0x40 + 0x40;
        }
        *(short *)((long)local_d8 + 0xc) = sVar31;
        *num_commands = (size_t)((long)&local_140->magic + *num_commands);
        position = (long)&pPVar35->magic + (long)&pPVar33->magic;
        pPVar29 = pPVar22;
        if (position < pPVar22) {
          pPVar29 = (PreparedDictionary *)position;
        }
        pPVar37 = (PreparedDictionary *)((long)&pPVar33->magic + 2);
        if (local_118 < (PreparedDictionary *)((ulong)pPVar35 >> 2)) {
          pPVar46 = (PreparedDictionary *)(position + (long)local_118 * -4);
          if (pPVar46 < pPVar37) {
            pPVar46 = pPVar37;
          }
          pPVar37 = pPVar46;
          if (pPVar29 < pPVar46) {
            pPVar37 = pPVar29;
          }
        }
        pPVar33 = (PreparedDictionary *)
                  ((char *)((long)&pPVar44->magic + (long)pPVar35 * 2) + (long)pPVar33);
        local_d8 = local_d8 + 2;
        pPVar35 = pPVar44;
        if (pPVar37 < pPVar29) {
          do {
            pPVar35 = (PreparedDictionary *)
                      (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                      ((ulong)pPVar37 & ringbuffer_mask)) *
                                            -0x1ca5842ca8642d00) >> 0x2c) + ((uint)pPVar37 & 0x18) &
                             0xfffff);
            *(uint *)(sVar11 + (long)pPVar35 * 4) = (uint)pPVar37;
            pPVar37 = (PreparedDictionary *)((long)&pPVar37->magic + 1);
          } while (pPVar29 != pPVar37);
        }
        local_140 = (PreparedDictionary *)0x0;
      }
      pPVar29 = (PreparedDictionary *)position;
    } while (&((PreparedDictionary *)position)->source_size < puVar3);
  }
  else {
    local_d8 = last_insert_len;
  }
  *(undefined1 **)dist_cache = puVar3 + ((long)&local_140->magic - position);
  *(long *)commands = *(long *)commands + ((long)local_d8 - (long)last_insert_len >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}